

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcEdgeCurve::~IfcEdgeCurve(IfcEdgeCurve *this)

{
  ~IfcEdgeCurve((IfcEdgeCurve *)&this[-1].field_0x80);
  return;
}

Assistant:

IfcEdgeCurve() : Object("IfcEdgeCurve") {}